

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_derive_keys(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_handshake_params *pmVar1;
  undefined8 local_68;
  uchar tmp [64];
  mbedtls_ssl_ciphersuite_t *ciphersuite_info;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  tmp._56_8_ = ssl->handshake->ciphersuite_info;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
             ,0x1981,"=> derive keys");
  ssl_local._4_4_ = ssl_set_handshake_prfs(ssl->handshake,(uint)*(byte *)(tmp._56_8_ + 0x11));
  if (ssl_local._4_4_ == 0) {
    ssl_local._4_4_ = ssl_compute_master(ssl->handshake,ssl->session_negotiate->master,ssl);
    if (ssl_local._4_4_ == 0) {
      memcpy(&local_68,ssl->handshake->randbytes,0x40);
      pmVar1 = ssl->handshake;
      *(undefined8 *)pmVar1->randbytes = tmp._24_8_;
      *(undefined8 *)(pmVar1->randbytes + 8) = tmp._32_8_;
      *(undefined8 *)(pmVar1->randbytes + 0x10) = tmp._40_8_;
      *(undefined8 *)(pmVar1->randbytes + 0x18) = tmp._48_8_;
      pmVar1 = ssl->handshake;
      *(undefined8 *)(pmVar1->randbytes + 0x20) = local_68;
      *(undefined8 *)(pmVar1->randbytes + 0x28) = tmp._0_8_;
      *(undefined8 *)(pmVar1->randbytes + 0x30) = tmp._8_8_;
      *(undefined8 *)(pmVar1->randbytes + 0x38) = tmp._16_8_;
      mbedtls_platform_zeroize(&local_68,0x40);
      ssl_local._4_4_ =
           ssl_tls12_populate_transform
                     (ssl->transform_negotiate,ssl->session_negotiate->ciphersuite,
                      ssl->session_negotiate->master,ssl->handshake->tls_prf,
                      ssl->handshake->randbytes,ssl->tls_version,(uint)ssl->conf->endpoint,ssl);
      if (ssl_local._4_4_ == 0) {
        mbedtls_platform_zeroize(ssl->handshake->randbytes,0x40);
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x19b4,"<= derive keys");
        ssl_local._4_4_ = 0;
      }
      else {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x19ac,"ssl_tls12_populate_transform",ssl_local._4_4_);
      }
    }
    else {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x1990,"ssl_compute_master",ssl_local._4_4_);
    }
  }
  else {
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1987,"ssl_set_handshake_prfs",ssl_local._4_4_);
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_derive_keys(mbedtls_ssl_context *ssl)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const mbedtls_ssl_ciphersuite_t * const ciphersuite_info =
        ssl->handshake->ciphersuite_info;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> derive keys"));

    /* Set PRF, calc_verify and calc_finished function pointers */
    ret = ssl_set_handshake_prfs(ssl->handshake,
                                 (mbedtls_md_type_t) ciphersuite_info->mac);
    if (ret != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_set_handshake_prfs", ret);
        return ret;
    }

    /* Compute master secret if needed */
    ret = ssl_compute_master(ssl->handshake,
                             ssl->session_negotiate->master,
                             ssl);
    if (ret != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_compute_master", ret);
        return ret;
    }

    /* Swap the client and server random values:
     * - MS derivation wanted client+server (RFC 5246 8.1)
     * - key derivation wants server+client (RFC 5246 6.3) */
    {
        unsigned char tmp[64];
        memcpy(tmp, ssl->handshake->randbytes, 64);
        memcpy(ssl->handshake->randbytes, tmp + 32, 32);
        memcpy(ssl->handshake->randbytes + 32, tmp, 32);
        mbedtls_platform_zeroize(tmp, sizeof(tmp));
    }

    /* Populate transform structure */
    ret = ssl_tls12_populate_transform(ssl->transform_negotiate,
                                       ssl->session_negotiate->ciphersuite,
                                       ssl->session_negotiate->master,
#if defined(MBEDTLS_SSL_SOME_SUITES_USE_CBC_ETM)
                                       ssl->session_negotiate->encrypt_then_mac,
#endif /* MBEDTLS_SSL_SOME_SUITES_USE_CBC_ETM */
                                       ssl->handshake->tls_prf,
                                       ssl->handshake->randbytes,
                                       ssl->tls_version,
                                       ssl->conf->endpoint,
                                       ssl);
    if (ret != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_tls12_populate_transform", ret);
        return ret;
    }

    /* We no longer need Server/ClientHello.random values */
    mbedtls_platform_zeroize(ssl->handshake->randbytes,
                             sizeof(ssl->handshake->randbytes));

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= derive keys"));

    return 0;
}